

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

int __thiscall
icu_63::TZEnumeration::clone
          (TZEnumeration *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TZEnumeration *this_00;
  
  this_00 = (TZEnumeration *)UMemory::operator_new((UMemory *)0x90,(size_t)__fn);
  if (this_00 != (TZEnumeration *)0x0) {
    TZEnumeration(this_00,this);
  }
  return (int)this_00;
}

Assistant:

virtual StringEnumeration *clone() const {
        return new TZEnumeration(*this);
    }